

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 float64_to_floatx80_mips64el(float64 a,float_status *status)

{
  long lVar1;
  floatx80 fVar2;
  int iVar3;
  commonNaNT a_00;
  float64 a_01;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  floatx80 fVar7;
  commonNaNT local_28;
  
  a_01 = float64_squash_input_denormal_mips64el(a,status);
  uVar4 = a_01 & 0xfffffffffffff;
  uVar5 = (uint)(a_01 >> 0x20);
  uVar6 = uVar5 >> 0x14 & 0x7ff;
  iVar3 = (int)uVar5 >> 0x1f;
  if (uVar6 == 0) {
    if (uVar4 == 0) {
      return (floatx80)(ZEXT416((uint)(iVar3 * -0x8000)) << 0x40);
    }
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar5 = ((uint)lVar1 ^ 0x3f) + 0xf5;
    uVar4 = uVar4 << ((byte)uVar5 & 0x3f);
    uVar6 = 1 - (uVar5 & 0xff);
  }
  else if (uVar6 == 0x7ff) {
    if (uVar4 != 0) {
      float64ToCommonNaN(&local_28,a_01,status);
      a_00.high = local_28.high;
      a_00.sign = local_28.sign;
      a_00._1_7_ = local_28._1_7_;
      a_00.low = local_28.low;
      fVar7 = commonNaNToFloatx80(a_00,status);
      return fVar7;
    }
    fVar7._8_4_ = iVar3 * -0x8000 | 0x7fff;
    fVar7.low = 0x8000000000000000;
    fVar7._12_4_ = 0;
    return fVar7;
  }
  fVar2._8_4_ = iVar3 * -0x8000 + uVar6 + 0x3c00;
  fVar2.low = uVar4 << 0xb | 0x8000000000000000;
  fVar2._12_4_ = 0;
  return fVar2;
}

Assistant:

floatx80 float64_to_floatx80(float64 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig;

    a = float64_squash_input_denormal(a, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return commonNaNToFloatx80(float64ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign,
                            floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
    }
    return
        packFloatx80(
            aSign, aExp + 0x3C00, (aSig | UINT64_C(0x0010000000000000)) << 11);

}